

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O0

FileName * __thiscall embree::FileName::addExt(FileName *this,string *ext)

{
  string *in_RDX;
  FileName *in_RSI;
  FileName *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  FileName(in_RSI,in_RDX);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return in_RDI;
}

Assistant:

FileName FileName::addExt(const std::string& ext) const {
    return FileName(filename+ext);
  }